

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageLoadAndStoreCase::ImageLoadAndStoreCase
          (ImageLoadAndStoreCase *this,Context *context,char *name,char *description,
          TextureFormat *format,TextureType textureType,deUint32 caseFlags)

{
  gles31::TestCase::TestCase
            (&this->super_TestCase,context,name,glcts::fixed_sample_locations_values + 1);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e53240;
  this->m_textureFormat = *(TextureFormat *)description;
  this->m_imageFormat = *(TextureFormat *)description;
  this->m_textureType = (TextureType)format;
  this->m_restrictImages = (bool)((byte)textureType >> 1 & 1);
  this->m_singleLayerBind = (bool)((byte)textureType & 1);
  return;
}

Assistant:

ImageLoadAndStoreCase (Context& context, const char* name, const char* description, const TextureFormat& format, TextureType textureType, deUint32 caseFlags = 0)
		: TestCase				(context, name, description)
		, m_textureFormat		(format)
		, m_imageFormat			(format)
		, m_textureType			(textureType)
		, m_restrictImages		((caseFlags & CASEFLAG_RESTRICT_IMAGES)		!= 0)
		, m_singleLayerBind		((caseFlags & CASEFLAG_SINGLE_LAYER_BIND)	!= 0)
	{
	}